

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd_internals.h
# Opt level: O1

sec_shard_t * sec_shard_pick(tsdn_t *tsdn,sec_t *sec)

{
  ulong uVar1;
  
  if (tsdn != (tsdn_t *)0x0) {
    if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_sec_shard == 0xff) {
      uVar1 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
              0x5851f42d4c957f2d + 0x14057b7ef767814f;
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar1;
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_sec_shard =
           (uint8_t)((uVar1 >> 0x20) * (sec->opts).nshards >> 0x20);
    }
    return (sec_shard_t *)
           ((long)&(sec->shards->mtx).field_0 +
           (ulong)((uint)(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_sec_shard
                  * 0x90));
  }
  return sec->shards;
}

Assistant:

JEMALLOC_ALWAYS_INLINE bool
tsdn_null(const tsdn_t *tsdn) {
	return tsdn == NULL;
}